

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# passpredict.cc
# Opt level: O0

double FindMaxElevation(CoordGeodetic *user_geo,SGP4 *sgp4,DateTime *aos,DateTime *los)

{
  bool bVar1;
  bool bVar2;
  bool local_141;
  TimeSpan local_140;
  int64_t local_138;
  int64_t local_130;
  undefined1 local_128 [8];
  CoordTopocentric topo;
  Eci eci;
  double max_elevation;
  DateTime time2;
  DateTime time1;
  DateTime current_time;
  double local_98;
  double time_step;
  undefined1 local_88 [7];
  bool running;
  Observer obs;
  DateTime *los_local;
  DateTime *aos_local;
  SGP4 *sgp4_local;
  CoordGeodetic *user_geo_local;
  
  obs.m_eci.m_velocity.w = (double)los;
  libsgp4::Observer::Observer((Observer *)local_88,user_geo);
  current_time.m_encoded = (int64_t)libsgp4::operator-((DateTime *)obs.m_eci.m_velocity.w,aos);
  local_98 = libsgp4::TimeSpan::TotalSeconds((TimeSpan *)&current_time);
  local_98 = local_98 / 9.0;
  time1 = (DateTime)aos->m_encoded;
  time2 = (DateTime)aos->m_encoded;
  max_elevation = *(double *)obs.m_eci.m_velocity.w;
  do {
    bVar1 = true;
    eci.m_velocity.w = -99999999999999.0;
    while( true ) {
      local_141 = false;
      if (bVar1) {
        local_141 = libsgp4::operator<(&time1,(DateTime *)&max_elevation);
      }
      if (local_141 == false) break;
      libsgp4::SGP4::FindPosition((Eci *)&topo.range_rate,sgp4,&time1);
      libsgp4::Observer::GetLookAngle
                ((CoordTopocentric *)local_128,(Observer *)local_88,(Eci *)&topo.range_rate);
      if (topo.azimuth <= eci.m_velocity.w) {
        bVar1 = false;
      }
      else {
        eci.m_velocity.w = topo.azimuth;
        local_130 = (int64_t)libsgp4::DateTime::AddSeconds(&time1,local_98);
        time1.m_encoded = local_130;
        bVar2 = libsgp4::operator>(&time1,(DateTime *)&max_elevation);
        if (bVar2) {
          time1.m_encoded = (int64_t)max_elevation;
        }
      }
    }
    local_138 = (int64_t)libsgp4::DateTime::AddSeconds(&time1,local_98 * -2.0);
    max_elevation = (double)time1.m_encoded;
    time2.m_encoded = local_138;
    time1.m_encoded = local_138;
    local_140 = libsgp4::operator-((DateTime *)&max_elevation,&time2);
    local_98 = libsgp4::TimeSpan::TotalSeconds(&local_140);
    local_98 = local_98 / 9.0;
  } while (1.0 < local_98);
  return eci.m_velocity.w;
}

Assistant:

double FindMaxElevation(
        const libsgp4::CoordGeodetic& user_geo,
        libsgp4::SGP4& sgp4,
        const libsgp4::DateTime& aos,
        const libsgp4::DateTime& los)
{
    libsgp4::Observer obs(user_geo);

    bool running;

    double time_step = (los - aos).TotalSeconds() / 9.0;
    libsgp4::DateTime current_time(aos); //! current time
    libsgp4::DateTime time1(aos); //! start time of search period
    libsgp4::DateTime time2(los); //! end time of search period
    double max_elevation; //! max elevation

    running = true;

    do
    {
        running = true;
        max_elevation = -99999999999999.0;
        while (running && current_time < time2)
        {
            /*
             * find position
             */
            libsgp4::Eci eci = sgp4.FindPosition(current_time);
            libsgp4::CoordTopocentric topo = obs.GetLookAngle(eci);

            if (topo.elevation > max_elevation)
            {
                /*
                 * still going up
                 */
                max_elevation = topo.elevation;
                /*
                 * move time along
                 */
                current_time = current_time.AddSeconds(time_step);
                if (current_time > time2)
                {
                    /*
                     * dont go past end time
                     */
                    current_time = time2;
                }
            }
            else
            {
                /*
                 * stop
                 */
                running = false;
            }
        }

        /*
         * make start time to 2 time steps back
         */
        time1 = current_time.AddSeconds(-2.0 * time_step);
        /*
         * make end time to current time
         */
        time2 = current_time;
        /*
         * current time to start time
         */
        current_time = time1;
        /*
         * recalculate time step
         */
        time_step = (time2 - time1).TotalSeconds() / 9.0;
    }
    while (time_step > 1.0);

    return max_elevation;
}